

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

ChaiScript_Basic * __thiscall
chaiscript::ChaiScript_Basic::add<chaiscript::Boxed_Value>
          (ChaiScript_Basic *this,Boxed_Value *t_t,string *t_name)

{
  Boxed_Value local_30;
  string *local_20;
  string *t_name_local;
  Boxed_Value *t_t_local;
  ChaiScript_Basic *this_local;
  
  local_20 = t_name;
  t_name_local = (string *)t_t;
  t_t_local = (Boxed_Value *)this;
  Name_Validator::validate_object_name<std::__cxx11::string>(t_name);
  Boxed_Value::Boxed_Value(&local_30,(Boxed_Value *)t_name_local);
  detail::Dispatch_Engine::add(&this->m_engine,&local_30,local_20);
  Boxed_Value::~Boxed_Value(&local_30);
  return this;
}

Assistant:

ChaiScript_Basic &add(const T &t_t, const std::string &t_name) {
      Name_Validator::validate_object_name(t_name);
      m_engine.add(t_t, t_name);
      return *this;
    }